

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# provider_core.c
# Opt level: O0

int ossl_provider_set_operation_bit(OSSL_PROVIDER *provider,size_t bitnum)

{
  int iVar1;
  char *file;
  char *func;
  ulong in_RSI;
  long in_RDI;
  uchar *tmp;
  uchar bit;
  size_t byte;
  CRYPTO_RWLOCK *in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffdc;
  int line;
  int local_4;
  
  file = (char *)(in_RSI >> 3);
  line = CONCAT13((char)(1 << ((byte)in_RSI & 7)),in_stack_ffffffffffffffdc);
  iVar1 = CRYPTO_THREAD_write_lock(in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (*(char **)(in_RDI + 0xb0) <= file) {
      func = (char *)CRYPTO_realloc(*(void **)(in_RDI + 0xa8),(int)file + 1,"crypto/provider_core.c"
                                    ,0x626);
      if (func == (char *)0x0) {
        CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
        ERR_new();
        ERR_set_debug(file,line,func);
        ERR_set_error(0xf,0xc0100,(char *)0x0);
        return 0;
      }
      *(char **)(in_RDI + 0xa8) = func;
      memset((void *)(*(long *)(in_RDI + 0xa8) + *(long *)(in_RDI + 0xb0)),0,
             (size_t)(file + (1 - *(long *)(in_RDI + 0xb0))));
      *(char **)(in_RDI + 0xb0) = file + 1;
    }
    file[*(long *)(in_RDI + 0xa8)] = file[*(long *)(in_RDI + 0xa8)] | (byte)((uint)line >> 0x18);
    CRYPTO_THREAD_unlock(in_stack_ffffffffffffffc8);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ossl_provider_set_operation_bit(OSSL_PROVIDER *provider, size_t bitnum)
{
    size_t byte = bitnum / 8;
    unsigned char bit = (1 << (bitnum % 8)) & 0xFF;

    if (!CRYPTO_THREAD_write_lock(provider->opbits_lock))
        return 0;
    if (provider->operation_bits_sz <= byte) {
        unsigned char *tmp = OPENSSL_realloc(provider->operation_bits,
                                             byte + 1);

        if (tmp == NULL) {
            CRYPTO_THREAD_unlock(provider->opbits_lock);
            ERR_raise(ERR_LIB_CRYPTO, ERR_R_MALLOC_FAILURE);
            return 0;
        }
        provider->operation_bits = tmp;
        memset(provider->operation_bits + provider->operation_bits_sz,
               '\0', byte + 1 - provider->operation_bits_sz);
        provider->operation_bits_sz = byte + 1;
    }
    provider->operation_bits[byte] |= bit;
    CRYPTO_THREAD_unlock(provider->opbits_lock);
    return 1;
}